

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalidUpdatableModelWrongBiases(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar7;
  ostream *poVar8;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  m1.isupdatable_ = true;
  m1.specificationversion_ = 4;
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"probs");
  this->isupdatable_ = true;
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this);
  this_00->inputchannels_ = 1;
  this_00->outputchannels_ = 1;
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
  pWVar7->isupdatable_ = true;
  this_00->hasbias_ = true;
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
  pWVar7->isupdatable_ = false;
  CoreML::Model::validate(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xc4);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testInvalidUpdatableModelWrongBiases() {

    /*
     checks that updatable peroperty is true for biases if the layer is marked as updatable.
     */

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    m1.set_isupdatable(true);
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("probs");
    innerProductLayer->set_isupdatable(true);

    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);

    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(false);

    Result res = Model::validate(m1);

    ML_ASSERT_BAD(res);
    return 0;
}